

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferSubDataCase::testWithBufferSize
          (ModifyAfterWithBufferSubDataCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  deUint64 dVar4;
  deUint64 dVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  iVar6 = bufferSize + 3;
  if (-1 < bufferSize) {
    iVar6 = bufferSize;
  }
  iVar1 = (*((this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar8 = (iVar6 >> 2) + 0xf;
  uVar2 = uVar8 & 0xfffffff0;
  iVar6 = bufferSize / 2;
  if (this->m_partialUpload == false) {
    iVar6 = bufferSize;
    uVar2 = 0;
  }
  uVar7 = iVar6 + 0xfU & 0xfffffff0;
  if (this->m_repeatedUpload == true) {
    iVar6 = bufferSize * 3 + 3;
    if (-1 < bufferSize * 3) {
      iVar6 = bufferSize * 3;
    }
    iVar9 = 1;
    do {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x168))
                (0x8892,(long)(int)uVar2,(long)(int)uVar7,
                 (this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      iVar3 = (*((this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).
                 super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x538))(0,(int)uVar8 >> 4,1);
      (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x538))(0,((iVar6 >> 2) + 0xf >> 4) + -1,1);
      iVar9 = iVar9 + -1;
    } while (iVar9 == 0);
  }
  dVar4 = deGetMicroseconds();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x168))
            (0x8892,(long)(int)uVar2,(long)(int)uVar7,
             (this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar5 = deGetMicroseconds();
  (result->duration).totalDuration = dVar5 - dVar4;
  (result->duration).fitResponseDuration = dVar5 - dVar4;
  result->writtenSize = uVar7;
  return;
}

Assistant:

void ModifyAfterWithBufferSubDataCase::testWithBufferSize (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	// always draw the same amount to make compares between cases sensible
	const int					drawStart			= deAlign32(bufferSize / 4, 4*4);
	const int					drawEnd				= deAlign32(bufferSize * 3 / 4, 4*4);

	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					subdataOffset		= deAlign32((m_partialUpload) ? (bufferSize / 4) : (0), 4*4);
	const int					subdataSize			= deAlign32((m_partialUpload) ? (bufferSize / 2) : (bufferSize), 4*4);
	deUint64					startTime;
	deUint64					endTime;

	// make upload-draw stream
	if (m_repeatedUpload)
	{
		for (int repeatNdx = 0; repeatNdx < NUM_REPEATS; ++repeatNdx)
		{
			gl.bufferSubData(GL_ARRAY_BUFFER, subdataOffset, subdataSize, &m_zeroData[0]);
			drawBufferRange(drawStart, drawEnd);
		}
	}

	// test upload
	startTime = deGetMicroseconds();
	gl.bufferSubData(GL_ARRAY_BUFFER, subdataOffset, subdataSize, &m_zeroData[0]);
	endTime = deGetMicroseconds();

	result.duration.totalDuration = endTime - startTime;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = subdataSize;
}